

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::stringPrintfRecursive<float&,char>(string *s,char *fmt,float *v,char *args)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char *in_RCX;
  float *in_RDX;
  string *in_RSI;
  string *in_RDI;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  char *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  string local_268 [24];
  string *in_stack_fffffffffffffdb0;
  char **in_stack_fffffffffffffdb8;
  char **in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  string local_220 [32];
  stringstream local_200 [16];
  undefined1 local_1f0 [40];
  char *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  LogLevel in_stack_fffffffffffffe54;
  float in_stack_fffffffffffffe8c;
  string local_78 [53];
  byte local_43;
  byte local_42;
  byte local_41;
  string local_40 [32];
  
  copyToFormatString(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  lVar2 = std::__cxx11::string::find((char)local_40,0x2a);
  local_41 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_40,0x73);
  local_42 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_40,100);
  local_43 = lVar2 != -1;
  if ((local_41 & 1) != 0) {
    LogFatal(in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
             in_stack_fffffffffffffe38);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88), bVar1)) {
    FloatToString_abi_cxx11_(in_stack_fffffffffffffe8c);
    std::__cxx11::string::operator+=(in_RDI,local_78);
    std::__cxx11::string::~string(local_78);
  }
  else {
    if ((local_43 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
               in_stack_fffffffffffffe38);
    }
    if ((local_42 & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                 in_stack_fffffffffffffe38);
      }
      std::__cxx11::string::c_str();
      formatOne<float&>(in_stack_fffffffffffffdc8,(float *)in_stack_fffffffffffffdc0);
      std::__cxx11::string::operator+=(in_RDI,local_268);
      std::__cxx11::string::~string(local_268);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_200);
      std::ostream::operator<<(local_1f0,*in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      std::__cxx11::string::operator+=(in_RDI,local_220);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
      std::__cxx11::stringstream::~stringstream(local_200);
    }
  }
  stringPrintfRecursive<char>(in_RSI,(char *)in_RDX,in_RCX);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}